

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O3

void __thiscall
OpenMD::PotVecAccumulator::get95percentConfidenceInterval(PotVecAccumulator *this,ResultType *ret)

{
  size_t sVar1;
  uint i;
  long lVar2;
  ResultType sd;
  ResultType local_48;
  
  local_48.data_[4] = 0.0;
  local_48.data_[5] = 0.0;
  local_48.data_[2] = 0.0;
  local_48.data_[3] = 0.0;
  local_48.data_[0] = 0.0;
  local_48.data_[1] = 0.0;
  local_48.data_[6] = 0.0;
  getStdDev(this,&local_48);
  sVar1 = (this->super_BaseAccumulator).Count_;
  lVar2 = 0;
  do {
    ret->data_[lVar2] =
         (local_48.data_[lVar2] * 1.96) /
         SQRT(((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
    lVar2 = lVar2 + 1;
  } while (lVar2 != 7);
  return;
}

Assistant:

void get95percentConfidenceInterval(ResultType& ret) {
      assert(Count_ != 0);
      ResultType sd;
      this->getStdDev(sd);
      for (unsigned int i = 0; i < N_INTERACTION_FAMILIES; i++) {
        ret[i] = 1.960 * sd[i] / sqrt(RealType(Count_));
      }
      return;
    }